

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O2

gdImagePtr gdImageCopyGaussianBlurred(gdImagePtr src,int radius,double sigma)

{
  int iVar1;
  double *coeffs;
  gdImagePtr dst;
  gdImagePtr dst_00;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (radius < 1) {
    return (gdImagePtr)0x0;
  }
  uVar3 = (ulong)(radius * 2 + 1);
  coeffs = (double *)gdMalloc(uVar3 * 8);
  if (coeffs == (double *)0x0) {
    return (gdImagePtr)0x0;
  }
  dVar7 = 0.0;
  dVar6 = (double)(-(ulong)(sigma <= 0.0) & (ulong)((double)radius * 0.6666666666666666) |
                  ~-(ulong)(sigma <= 0.0) & (ulong)sigma);
  iVar2 = -radius;
  for (uVar4 = ~(long)radius; (uint)radius != uVar4; uVar4 = uVar4 + 1) {
    dVar5 = exp((double)-(iVar2 * iVar2) / ((dVar6 + dVar6) * dVar6));
    dVar7 = dVar7 + dVar5;
    coeffs[(ulong)(uint)radius + uVar4 + 1] = dVar5;
    iVar2 = iVar2 + 1;
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    coeffs[uVar4] = coeffs[uVar4] / dVar7;
  }
  iVar2 = src->trueColor;
  if (iVar2 == 0) {
    src = gdImageClone(src);
    if (src == (gdImagePtr)0x0) goto LAB_00114461;
    iVar1 = gdImagePaletteToTrueColor(src);
    if (iVar1 == 0) {
      gdImageDestroy(src);
      goto LAB_00114461;
    }
  }
  dst = gdImageCreateTrueColor(src->sx,src->sy);
  if (dst != (gdImagePtr)0x0) {
    applyCoeffs(src,dst,coeffs,radius,HORIZONTAL);
    dst_00 = gdImageCreateTrueColor(src->sx,src->sy);
    if (dst_00 != (gdImagePtr)0x0) {
      applyCoeffs(dst,dst_00,coeffs,radius,VERTICAL);
    }
    gdImageDestroy(dst);
    gdFree(coeffs);
    if (iVar2 == 0) {
      gdImageDestroy(src);
      return dst_00;
    }
    return dst_00;
  }
LAB_00114461:
  gdFree(coeffs);
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr)
gdImageCopyGaussianBlurred(gdImagePtr src, int radius, double sigma)
{
    gdImagePtr tmp = NULL, result = NULL;
    double *coeffs;
    int freeSrc = 0;

    if (radius < 1) {
        return NULL;
    }/* if */

    /* Compute the coefficients. */
    coeffs = gaussian_coeffs(radius, sigma);
    if (!coeffs) {
        return NULL;
    }/* if */

    /* If the image is not truecolor, we first make a truecolor
     * scratch copy. */
	if (!src->trueColor) {
        int tcstat;

        src = gdImageClone(src);
        if (!src) {
			gdFree(coeffs);
			return NULL;
		}

        tcstat = gdImagePaletteToTrueColor(src);
        if (!tcstat) {
            gdImageDestroy(src);
			gdFree(coeffs);
            return NULL;
        }/* if */
		
        freeSrc = 1;
	}/* if */

    /* Apply the filter horizontally. */
    tmp = gdImageCreateTrueColor(src->sx, src->sy);
    if (!tmp) {
		gdFree(coeffs);
		return NULL;
	}
    applyCoeffs(src, tmp, coeffs, radius, HORIZONTAL);

    /* Apply the filter vertically. */
    result = gdImageCreateTrueColor(src->sx, src->sy);
    if (result) {
        applyCoeffs(tmp, result, coeffs, radius, VERTICAL);
    }/* if */

    gdImageDestroy(tmp);
    gdFree(coeffs);

    if (freeSrc) gdImageDestroy(src);

    return result;
}